

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void testing::Mock::RegisterUseByOnCallOrExpectCall(void *mock_obj,char *file,int line)

{
  StateMap *this;
  mapped_type *pmVar1;
  UnitTest *this_00;
  TestInfo *this_01;
  char *pcVar2;
  TestInfo *test_info;
  MockObjectState *state;
  MutexLock l;
  int line_local;
  char *file_local;
  void *mock_obj_local;
  
  l.mutex_._4_4_ = line;
  file_local = (char *)mock_obj;
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)&state,(MutexBase *)internal::g_gmock_mutex);
  this = anon_unknown_18::MockObjectRegistry::states
                   ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  pmVar1 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[](this,&file_local);
  if (pmVar1->first_used_file == (char *)0x0) {
    pmVar1->first_used_file = file;
    pmVar1->first_used_line = l.mutex_._4_4_;
    this_00 = UnitTest::GetInstance();
    this_01 = UnitTest::current_test_info(this_00);
    if (this_01 != (TestInfo *)0x0) {
      pcVar2 = TestInfo::test_case_name(this_01);
      std::__cxx11::string::operator=((string *)&pmVar1->first_used_test_case,pcVar2);
      pcVar2 = TestInfo::name(this_01);
      std::__cxx11::string::operator=((string *)&pmVar1->first_used_test,pcVar2);
    }
  }
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&state);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  MockObjectState& state = g_mock_object_registry.states()[mock_obj];
  if (state.first_used_file == NULL) {
    state.first_used_file = file;
    state.first_used_line = line;
    const TestInfo* const test_info =
        UnitTest::GetInstance()->current_test_info();
    if (test_info != NULL) {
      // TODO(wan@google.com): record the test case name when the
      // ON_CALL or EXPECT_CALL is invoked from SetUpTestCase() or
      // TearDownTestCase().
      state.first_used_test_case = test_info->test_case_name();
      state.first_used_test = test_info->name();
    }
  }
}